

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBridge.c
# Opt level: O3

DdNode * Cudd_addBddIthBit(DdManager *dd,DdNode *f,int bit)

{
  int *piVar1;
  DdNode *index;
  DdNode *pDVar2;
  
  index = cuddUniqueConst(dd,(double)bit);
  if (index != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)index & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    do {
      dd->reordered = 0;
      pDVar2 = addBddDoIthBit(dd,f,index);
    } while (dd->reordered == 1);
    if (pDVar2 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDeref(dd,index);
      piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
      return pDVar2;
    }
    Cudd_RecursiveDeref(dd,index);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_addBddIthBit(
  DdManager * dd,
  DdNode * f,
  int  bit)
{
    DdNode *res;
    DdNode *index;
    
    index = cuddUniqueConst(dd,(CUDD_VALUE_TYPE) bit);
    if (index == NULL) return(NULL);
    cuddRef(index);

    do {
        dd->reordered = 0;
        res = addBddDoIthBit(dd, f, index);
    } while (dd->reordered == 1);

    if (res == NULL) {
        Cudd_RecursiveDeref(dd, index);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(dd, index);
    cuddDeref(res);
    return(res);

}